

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::setMinimumPDFVersion(QPDFWriter *this,string *version,int extension_level)

{
  int iVar1;
  string *psVar2;
  int iVar3;
  ulong uVar4;
  element_type *peVar5;
  int local_30;
  int compare;
  int min_minor;
  int min_major;
  int old_minor;
  int old_major;
  bool set_extension_level;
  bool set_version;
  string *psStack_18;
  int extension_level_local;
  string *version_local;
  QPDFWriter *this_local;
  
  old_minor._3_1_ = 0;
  old_minor._2_1_ = 0;
  old_major = extension_level;
  psStack_18 = version;
  version_local = (string *)this;
  std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    min_major = 0;
    min_minor = 0;
    compare = 0;
    local_30 = 0;
    parseVersion(this,psStack_18,&min_major,&min_minor);
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    parseVersion(this,&peVar5->min_pdf_version,&compare,&local_30);
    iVar3 = compareVersions(this,min_major,min_minor,compare,local_30);
    iVar1 = old_major;
    if (iVar3 < 1) {
      if ((iVar3 == 0) &&
         (peVar5 = std::
                   __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this), peVar5->min_extension_level < iVar1)) {
        QTC::TC("qpdf","QPDFWriter increasing extension level",0);
        old_minor._2_1_ = 1;
      }
    }
    else {
      QTC::TC("qpdf","QPDFWriter increasing minimum version",(uint)(old_major != 0));
      old_minor._3_1_ = 1;
      old_minor._2_1_ = 1;
    }
  }
  else {
    old_minor._3_1_ = 1;
    old_minor._2_1_ = 1;
  }
  psVar2 = psStack_18;
  if ((old_minor._3_1_ & 1) != 0) {
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::operator=((string *)&peVar5->min_pdf_version,(string *)psVar2);
  }
  iVar1 = old_major;
  if ((old_minor._2_1_ & 1) != 0) {
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar5->min_extension_level = iVar1;
  }
  return;
}

Assistant:

void
QPDFWriter::setMinimumPDFVersion(std::string const& version, int extension_level)
{
    bool set_version = false;
    bool set_extension_level = false;
    if (m->min_pdf_version.empty()) {
        set_version = true;
        set_extension_level = true;
    } else {
        int old_major = 0;
        int old_minor = 0;
        int min_major = 0;
        int min_minor = 0;
        parseVersion(version, old_major, old_minor);
        parseVersion(m->min_pdf_version, min_major, min_minor);
        int compare = compareVersions(old_major, old_minor, min_major, min_minor);
        if (compare > 0) {
            QTC::TC("qpdf", "QPDFWriter increasing minimum version", extension_level == 0 ? 0 : 1);
            set_version = true;
            set_extension_level = true;
        } else if (compare == 0) {
            if (extension_level > m->min_extension_level) {
                QTC::TC("qpdf", "QPDFWriter increasing extension level");
                set_extension_level = true;
            }
        }
    }

    if (set_version) {
        m->min_pdf_version = version;
    }
    if (set_extension_level) {
        m->min_extension_level = extension_level;
    }
}